

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O3

void __thiscall
Assimp::FindInvalidDataProcess::ProcessAnimationChannel
          (FindInvalidDataProcess *this,aiNodeAnim *anim)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  undefined8 uVar5;
  double dVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool bVar11;
  aiQuatKey *paVar12;
  aiVectorKey *paVar13;
  Logger *this_00;
  long lVar14;
  aiQuatKey *n;
  ulong uVar15;
  long lVar16;
  aiVectorKey v;
  float local_48;
  
  if (anim == (aiNodeAnim *)0x0) {
    __assert_fail("nullptr != anim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/FindInvalidDataProcess.cpp"
                  ,0x11c,
                  "void Assimp::FindInvalidDataProcess::ProcessAnimationChannel(aiNodeAnim *)");
  }
  uVar4 = anim->mNumPositionKeys;
  bVar7 = false;
  bVar11 = false;
  if (uVar4 != 1) {
    if (uVar4 == 0) {
      if ((anim->mNumRotationKeys == 0) && (anim->mNumScalingKeys == 0)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/FindInvalidDataProcess.cpp"
                      ,0x11e,
                      "void Assimp::FindInvalidDataProcess::ProcessAnimationChannel(aiNodeAnim *)");
      }
    }
    else {
      paVar13 = anim->mPositionKeys;
      fVar3 = this->configEpsilon;
      lVar16 = (ulong)(uVar4 - 1) * 0x18;
      lVar14 = -0x18;
      bVar7 = bVar11;
      if (fVar3 == 0.0) {
        while( true ) {
          if (lVar16 == lVar14 + 0x18) goto LAB_003caaf5;
          fVar3 = *(float *)((long)&paVar13[2].mValue.x + lVar14);
          pfVar1 = (float *)((long)&paVar13[1].mValue.x + lVar14);
          if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) break;
          fVar3 = *(float *)((long)&paVar13[2].mValue.y + lVar14);
          pfVar1 = (float *)((long)&paVar13[1].mValue.y + lVar14);
          if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) break;
          fVar3 = *(float *)((long)&paVar13[2].mValue.z + lVar14);
          pfVar1 = (float *)((long)&paVar13[1].mValue.z + lVar14);
          if ((fVar3 != *pfVar1) || (lVar14 = lVar14 + 0x18, NAN(fVar3) || NAN(*pfVar1))) break;
        }
      }
      else {
        do {
          if (lVar16 == lVar14 + 0x18) goto LAB_003caaf5;
        } while (((fVar3 < ABS(*(float *)((long)&paVar13[1].mValue.x + lVar14) -
                               *(float *)((long)&paVar13[2].mValue.x + lVar14))) &&
                 (fVar3 < ABS(*(float *)((long)&paVar13[1].mValue.y + lVar14) -
                              *(float *)((long)&paVar13[2].mValue.y + lVar14)))) &&
                (pfVar1 = (float *)((long)&paVar13[1].mValue.z + lVar14),
                pfVar2 = (float *)((long)&paVar13[2].mValue.z + lVar14), lVar14 = lVar14 + 0x18,
                fVar3 < ABS(*pfVar1 - *pfVar2)));
      }
    }
  }
LAB_003cab38:
  if (1 < anim->mNumRotationKeys) {
    paVar12 = anim->mRotationKeys;
    fVar3 = this->configEpsilon;
    uVar15 = (ulong)(anim->mNumRotationKeys - 1);
    if (fVar3 == 0.0) {
      lVar16 = -0x18;
      while( true ) {
        if (uVar15 * 0x18 == lVar16 + 0x18) goto LAB_003cabfe;
        fVar3 = *(float *)((long)&paVar12[2].mValue.x + lVar16);
        pfVar1 = (float *)((long)&paVar12[1].mValue.x + lVar16);
        if (((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) ||
           ((fVar3 = *(float *)((long)&paVar12[2].mValue.y + lVar16),
            pfVar1 = (float *)((long)&paVar12[1].mValue.y + lVar16), fVar3 != *pfVar1 ||
            (((NAN(fVar3) || NAN(*pfVar1) ||
              (fVar3 = *(float *)((long)&paVar12[2].mValue.z + lVar16),
              pfVar1 = (float *)((long)&paVar12[1].mValue.z + lVar16), fVar3 != *pfVar1)) ||
             (NAN(fVar3) || NAN(*pfVar1))))))) break;
        fVar3 = *(float *)((long)&paVar12[2].mValue.w + lVar16);
        pfVar1 = (float *)((long)&paVar12[1].mValue.w + lVar16);
        if ((fVar3 != *pfVar1) || (lVar16 = lVar16 + 0x18, NAN(fVar3) || NAN(*pfVar1))) break;
      }
    }
    else {
      lVar16 = uVar15 + 1;
      n = paVar12;
      do {
        lVar16 = lVar16 + -1;
        if (lVar16 == 0) goto LAB_003cabfe;
        bVar11 = EpsilonCompare<aiQuatKey>(n,n + 1,fVar3);
        n = n + 1;
      } while (bVar11);
    }
  }
LAB_003cac47:
  if (1 < anim->mNumScalingKeys) {
    paVar13 = anim->mScalingKeys;
    fVar3 = this->configEpsilon;
    lVar16 = (ulong)(anim->mNumScalingKeys - 1) * 0x18;
    lVar14 = -0x18;
    if (fVar3 == 0.0) {
      while( true ) {
        if (lVar16 == lVar14 + 0x18) goto LAB_003cad1f;
        fVar3 = *(float *)((long)&paVar13[2].mValue.x + lVar14);
        pfVar1 = (float *)((long)&paVar13[1].mValue.x + lVar14);
        if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) break;
        fVar3 = *(float *)((long)&paVar13[2].mValue.y + lVar14);
        pfVar1 = (float *)((long)&paVar13[1].mValue.y + lVar14);
        if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) break;
        fVar3 = *(float *)((long)&paVar13[2].mValue.z + lVar14);
        pfVar1 = (float *)((long)&paVar13[1].mValue.z + lVar14);
        if ((fVar3 != *pfVar1) || (lVar14 = lVar14 + 0x18, NAN(fVar3) || NAN(*pfVar1))) break;
      }
    }
    else {
      do {
        if (lVar16 == lVar14 + 0x18) goto LAB_003cad1f;
      } while (((fVar3 < ABS(*(float *)((long)&paVar13[1].mValue.x + lVar14) -
                             *(float *)((long)&paVar13[2].mValue.x + lVar14))) &&
               (fVar3 < ABS(*(float *)((long)&paVar13[1].mValue.y + lVar14) -
                            *(float *)((long)&paVar13[2].mValue.y + lVar14)))) &&
              (pfVar1 = (float *)((long)&paVar13[1].mValue.z + lVar14),
              pfVar2 = (float *)((long)&paVar13[2].mValue.z + lVar14), lVar14 = lVar14 + 0x18,
              fVar3 < ABS(*pfVar1 - *pfVar2)));
    }
  }
  if (!bVar7) {
    return;
  }
LAB_003cad5d:
  this_00 = DefaultLogger::get();
  Logger::warn(this_00,"Simplified dummy tracks with just one key");
  return;
LAB_003caaf5:
  uVar5 = *(undefined8 *)&(paVar13->mValue).z;
  dVar6 = paVar13->mTime;
  fVar3 = (paVar13->mValue).x;
  fVar8 = (paVar13->mValue).y;
  operator_delete__(paVar13);
  anim->mNumPositionKeys = 1;
  paVar13 = (aiVectorKey *)operator_new__(0x18);
  anim->mPositionKeys = paVar13;
  paVar13->mTime = dVar6;
  (paVar13->mValue).x = fVar3;
  (paVar13->mValue).y = fVar8;
  local_48 = (float)uVar5;
  (paVar13->mValue).z = local_48;
  bVar7 = true;
  goto LAB_003cab38;
LAB_003cabfe:
  fVar9 = (paVar12->mValue).y;
  fVar10 = (paVar12->mValue).z;
  dVar6 = paVar12->mTime;
  fVar3 = (paVar12->mValue).w;
  fVar8 = (paVar12->mValue).x;
  operator_delete__(paVar12);
  anim->mNumRotationKeys = 1;
  paVar12 = (aiQuatKey *)operator_new__(0x18);
  anim->mRotationKeys = paVar12;
  paVar12->mTime = dVar6;
  (paVar12->mValue).w = fVar3;
  (paVar12->mValue).x = fVar8;
  (paVar12->mValue).y = fVar9;
  (paVar12->mValue).z = fVar10;
  bVar7 = true;
  goto LAB_003cac47;
LAB_003cad1f:
  uVar5 = *(undefined8 *)&(paVar13->mValue).z;
  dVar6 = paVar13->mTime;
  fVar3 = (paVar13->mValue).x;
  fVar8 = (paVar13->mValue).y;
  operator_delete__(paVar13);
  anim->mNumScalingKeys = 1;
  paVar13 = (aiVectorKey *)operator_new__(0x18);
  anim->mScalingKeys = paVar13;
  paVar13->mTime = dVar6;
  (paVar13->mValue).x = fVar3;
  (paVar13->mValue).y = fVar8;
  local_48 = (float)uVar5;
  (paVar13->mValue).z = local_48;
  goto LAB_003cad5d;
}

Assistant:

void FindInvalidDataProcess::ProcessAnimationChannel (aiNodeAnim* anim) {
    ai_assert( nullptr != anim );
    if (anim->mNumPositionKeys == 0 && anim->mNumRotationKeys == 0 && anim->mNumScalingKeys == 0) {
        ai_assert_entry();
        return;
    }

    // Check whether all values in a tracks are identical - in this case
    // we can remove al keys except one.
    // POSITIONS
    int i = 0;
    if (anim->mNumPositionKeys > 1 && AllIdentical(anim->mPositionKeys,anim->mNumPositionKeys,configEpsilon)) {
        aiVectorKey v = anim->mPositionKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mPositionKeys;
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys = 1];
        anim->mPositionKeys[0] = v;
        i = 1;
    }

    // ROTATIONS
    if (anim->mNumRotationKeys > 1 && AllIdentical(anim->mRotationKeys,anim->mNumRotationKeys,configEpsilon)) {
        aiQuatKey v = anim->mRotationKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mRotationKeys;
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys = 1];
        anim->mRotationKeys[0] = v;
        i = 1;
    }

    // SCALINGS
    if (anim->mNumScalingKeys > 1 && AllIdentical(anim->mScalingKeys,anim->mNumScalingKeys,configEpsilon)) {
        aiVectorKey v = anim->mScalingKeys[0];

        // Reallocate ... we need just ONE element, it makes no sense to reuse the array
        delete[] anim->mScalingKeys;
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys = 1];
        anim->mScalingKeys[0] = v;
        i = 1;
    }
    if ( 1 == i ) {
        ASSIMP_LOG_WARN("Simplified dummy tracks with just one key");
    }
}